

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

void __thiscall trun::TestRunner::ExecuteTests(TestRunner *this)

{
  TestExecutiontype TVar1;
  Log *pLVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Config *pCVar5;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_01;
  double arguments_1;
  Timer t;
  Timer TStack_48;
  string local_40;
  
  Timer::Timer(&TStack_48);
  pLVar2 = this->pLogger;
  iVar4 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_IDynLibrary[6])();
  gnilk::Log::Info<char_const*,char_const*>
            (pLVar2,"Starting library test for: %s",*(char **)CONCAT44(extraout_var,iVar4));
  pLVar2 = this->pLogger;
  Version::AsString_abi_cxx11_
            (&local_40,
             &((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->version);
  gnilk::Log::Info<char_const*,char_const*>
            (pLVar2,"Library using test-interface version: %s",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  Timer::Reset(&TStack_48);
  pCVar5 = Config::Instance();
  if (pCVar5->isSubProcess == false) {
    iVar4 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_IDynLibrary[6])();
    printf("---> Start Module \t%s\n",*(undefined8 *)CONCAT44(extraout_var_00,iVar4));
    Version::AsString_abi_cxx11_
              (&local_40,
               &((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->version);
    printf("---> Mod.Test.Ver \t%s\n",local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
  }
  lVar6 = _ZTWL13threadContext();
  *(TestRunner **)(lVar6 + 0x10) = this;
  pCVar5 = Config::Instance();
  TVar1 = pCVar5->testExecutionType;
  if ((TVar1 == kThreaded) &&
     ((((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      version).data.ver.major == '\x01')) {
    pCVar5 = Config::Instance();
    pCVar5->testExecutionType = kThreadedWithExit;
  }
  bVar3 = ExecuteMain(this);
  if (bVar3) {
    ExecuteModuleTests(this);
    ExecuteMainExit(this);
  }
  pCVar5 = Config::Instance();
  pCVar5->testExecutionType = TVar1;
  pCVar5 = Config::Instance();
  if (pCVar5->isSubProcess == false) {
    iVar4 = (*((this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_IDynLibrary[6])();
    printf("<--- End Module  \t%s\n",*(undefined8 *)CONCAT44(extraout_var_01,iVar4));
    pLVar2 = this->pLogger;
    arguments_1 = Timer::Sample(&TStack_48);
    gnilk::Log::Info<char_const*,double>(pLVar2,"Module done (%.3f sec)",arguments_1);
  }
  return;
}

Assistant:

void TestRunner::ExecuteTests() {
    // Create and sort tests according to naming convention
    Timer t;
    pLogger->Info("Starting library test for: %s", library->Name().c_str());
    pLogger->Info("Library using test-interface version: %s", library->GetVersion().AsString().c_str());
    t.Reset();

    if (!Config::Instance().isSubProcess) {
        printf("---> Start Module \t%s\n", library->Name().c_str());
        printf("---> Mod.Test.Ver \t%s\n",  library->GetVersion().AsString().c_str());
    }

    // Update the thread context with ourselves, we do this directly as it won't change
    SetCurrentTestRunner(this);

    // In case of version 1 for this library we should use 'kThreadedWithExit'
    // Since V1 of the testrunner didn't return a value for the ASSERT
    auto oldTestExecutionType = Config::Instance().testExecutionType;
    if ((oldTestExecutionType == TestExecutiontype::kThreaded) && (library->GetVersion().Major() == 1)) {
        Config::Instance().testExecutionType = TestExecutiontype::kThreadedWithExit;
    }

    // Execute...
    if (ExecuteMain()) {
        ExecuteModuleTests();
        ExecuteMainExit();
    }

    // Restore the test execution type
    Config::Instance().testExecutionType = oldTestExecutionType;

    if (!Config::Instance().isSubProcess) {
        printf("<--- End Module  \t%s\n", library->Name().c_str());
        pLogger->Info("Module done (%.3f sec)", t.Sample());
    }
}